

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module-utils.h
# Opt level: O2

unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_> __thiscall
anon_func::Mapper::create(Mapper *this)

{
  Module *module;
  Map *map;
  _func_int **this_00;
  long in_RSI;
  function<void_(wasm::Function_*,_wasm::(anonymous_namespace)::Unsubtyping_&)> local_50;
  
  module = *(Module **)(in_RSI + 0x130);
  map = *(Map **)(in_RSI + 0x138);
  this_00 = (_func_int **)operator_new(0x160);
  std::function<void_(wasm::Function_*,_wasm::(anonymous_namespace)::Unsubtyping_&)>::function
            (&local_50,
             (function<void_(wasm::Function_*,_wasm::(anonymous_namespace)::Unsubtyping_&)> *)
             (in_RSI + 0x140));
  ::wasm::ModuleUtils::ParallelFunctionAnalysis<wasm::(anonymous_namespace)::Unsubtyping,(wasm::
  Mutability)0,wasm::ModuleUtils::DefaultMap>::doAnalysis(std::function<void(wasm::Function*,wasm::
  (anonymous_namespace)::Unsubtyping&)>)::Mapper::Mapper(wasm::Module&,std::map<wasm::Function*,wasm
  ::(anonymous_namespace)::Unsubtyping,std::less<wasm::Function*>,std::allocator<std::pair<wasm::
  Function*const,wasm::(anonymous_namespace)::Unsubtyping>>>&,std::function<void(wasm::
  Function*,wasm::(anonymous)::Unsubtyping__>_(this_00,module,map,(Func *)&local_50);
  std::_Function_base::~_Function_base(&local_50.super__Function_base);
  (this->super_WalkerPass<wasm::PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>_>).super_Pass.
  _vptr_Pass = this_00;
  return (__uniq_ptr_data<wasm::Pass,_std::default_delete<wasm::Pass>,_true,_true>)
         (__uniq_ptr_data<wasm::Pass,_std::default_delete<wasm::Pass>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Pass> create() override {
        return std::make_unique<Mapper>(module, map, work);
      }